

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.h
# Opt level: O3

void __thiscall cfd::core::KeyFormatData::~KeyFormatData(KeyFormatData *this)

{
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->has_format_).super__Bvector_base<std::allocator<bool>_>);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this);
  return;
}

Assistant:

class CFD_CORE_EXPORT KeyFormatData {
 public:
  /**
   * @brief constructor.
   */
  KeyFormatData();
  /**
   * @brief constructor.
   * @param[in] is_mainnet_on_default     default mainnet flag
   */
  explicit KeyFormatData(bool is_mainnet_on_default);
  /**
   * @brief constructor.
   * @param[in] map_data     prefix setting map
   */
  explicit KeyFormatData(const std::map<std::string, std::string> &map_data);
  /**
   * @brief copy constructor.
   * @param[in] object    KeyFormatData object
   */
  KeyFormatData(const KeyFormatData &object);
  /**
   * @brief copy constructor.
   * @param[in] object    KeyFormatData object
   * @return KeyFormatData object
   */
  KeyFormatData &operator=(const KeyFormatData &object);

  /**
   * @brief Check exist key.
   * @param[in] key   mapping key
   * @retval true   exist
   * @retval false  not exist
   */
  bool IsFind(const std::string &key) const;
  /**
   * @brief Get string value.
   * @param[in] key   mapping key
   * @return value
   */
  std::string GetString(const std::string &key) const;
  /**
   * @brief Get numeric value from string.
   * @param[in] key   mapping key
   * @return uint32_t value
   */
  uint32_t GetValue(const std::string &key) const;

  /**
   * @brief Get WIF prefix.
   * @return uint8_t value
   */
  uint32_t GetWifPrefix() const;
  /**
   * @brief Get Extkey version pair.
   * @param[in] version   extkey version
   * @return Version pair struct.
   */
  ExtkeyVersionPair GetVersionPair(uint32_t version) const;
  /**
   * @brief Get Extkey version pair.
   * @param[in] format_type   format type.
   * @return Version pair struct.
   */
  ExtkeyVersionPair GetVersionPair(Bip32FormatType format_type) const;
  /**
   * @brief Get Extkey version format type.
   * @param[in] version   extkey version
   * @return format type.
   */
  Bip32FormatType GetVersionFormatType(uint32_t version) const;
  /**
   * @brief Find relational extkey version.
   * @param[in] version   extkey version
   * @retval true   find.
   * @retval false  not found.
   */
  bool IsFindVersion(uint32_t version) const;
  /**
   * @brief Find relational format type.
   * @param[in] format_type   format type.
   * @retval true   find.
   * @retval false  not found.
   */
  bool IsFindFormatType(Bip32FormatType format_type) const;

  /**
   * @brief Get network type.
   * @return network type
   */
  NetType GetNetType() const;
  /**
   * @brief Check mainnet data.
   * @retval true   mainnet
   * @retval false  testnet
   */
  bool IsMainnet() const;

  /**
   * @brief Check format item.
   * @retval true   valid
   * @retval false  invalid
   */
  bool IsValid() const;

  /**
   * @brief Load cache.
   * @retval true   valid
   * @retval false  invalid
   */
  bool LoadCache();

  /**
   * @brief Get Address format data from json string.
   * @param[in] json_data       json string
   * @return Address format data
   */
  static KeyFormatData ConvertFromJson(const std::string &json_data);
  /**
   * @brief Get Address format data list from json string.
   * @param[in] json_data       json string
   * @return Address format data list
   */
  static std::vector<KeyFormatData> ConvertListFromJson(
      const std::string &json_data);

 private:
  std::map<std::string, std::string> map_;  //!< map
  // cache values
  bool is_mainnet = false;            //!< mainnet flag cache
  uint8_t wif_prefix_ = 0;            //!< wif prefix cache
  std::vector<bool> has_format_;      //!< enable format list
  ExtkeyVersionPair bip32_ = {0, 0};  //!< bip32 prefix cache
  ExtkeyVersionPair bip49_ = {0, 0};  //!< bip32 prefix cache
  ExtkeyVersionPair bip84_ = {0, 0};  //!< bip32 prefix cache
}